

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CordOutputStream::Next(CordOutputStream *this,void **data,int *size)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  unsigned_long *puVar4;
  pointer pcVar5;
  size_type sVar6;
  undefined1 local_88 [8];
  Span<char> span;
  CordBuffer local_58;
  Cord local_48;
  ulong local_38;
  size_t cord_size;
  size_t max_size;
  size_t desired_size;
  int *size_local;
  void **data_local;
  CordOutputStream *this_local;
  
  desired_size = (size_t)size;
  size_local = (int *)data;
  data_local = (void **)this;
  sVar2 = absl::lts_20240722::Cord::size(&this->cord_);
  sVar3 = absl::lts_20240722::CordBuffer::length(&this->buffer_);
  local_38 = sVar2 + sVar3;
  if (local_38 < this->size_hint_) {
    cord_size = this->size_hint_ - local_38;
    max_size = cord_size;
  }
  else {
    puVar4 = std::max<unsigned_long>(&local_38,&Next::kMinBlockSize);
    max_size = *puVar4;
    cord_size = std::numeric_limits<unsigned_long>::max();
  }
  switch(this->state_) {
  case kFull:
    sVar2 = absl::lts_20240722::CordBuffer::length(&this->buffer_);
    if (sVar2 == 0) {
      __assert_fail("buffer_.length() > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                    ,0x26a,
                    "virtual bool google::protobuf::io::CordOutputStream::Next(void **, int *)");
    }
    absl::lts_20240722::CordBuffer::CordBuffer(&local_58,&this->buffer_);
    absl::lts_20240722::Cord::Append(&this->cord_,&local_58);
    absl::lts_20240722::CordBuffer::~CordBuffer(&local_58);
  case kEmpty:
    sVar2 = absl::lts_20240722::CordBuffer::length(&this->buffer_);
    if (sVar2 != 0) {
      __assert_fail("buffer_.length() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                    ,0x26e,
                    "virtual bool google::protobuf::io::CordOutputStream::Next(void **, int *)");
    }
    absl::lts_20240722::CordBuffer::CreateWithDefaultLimit((CordBuffer *)&span.len_,max_size);
    absl::lts_20240722::CordBuffer::operator=(&this->buffer_,(CordBuffer *)&span.len_);
    absl::lts_20240722::CordBuffer::~CordBuffer((CordBuffer *)&span.len_);
    break;
  case kPartial:
    sVar2 = absl::lts_20240722::CordBuffer::length(&this->buffer_);
    sVar3 = absl::lts_20240722::CordBuffer::capacity(&this->buffer_);
    if (sVar3 <= sVar2) {
      __assert_fail("buffer_.length() < buffer_.capacity()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                    ,0x267,
                    "virtual bool google::protobuf::io::CordOutputStream::Next(void **, int *)");
    }
    break;
  case kSteal:
    sVar2 = absl::lts_20240722::CordBuffer::length(&this->buffer_);
    if (sVar2 != 0) {
      __assert_fail("buffer_.length() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                    ,0x262,
                    "virtual bool google::protobuf::io::CordOutputStream::Next(void **, int *)");
    }
    absl::lts_20240722::Cord::GetAppendBuffer(&local_48,(size_t)&this->cord_,max_size);
    absl::lts_20240722::CordBuffer::operator=(&this->buffer_,(CordBuffer *)&local_48);
    absl::lts_20240722::CordBuffer::~CordBuffer((CordBuffer *)&local_48);
  }
  _local_88 = absl::lts_20240722::CordBuffer::available(&this->buffer_);
  bVar1 = absl::lts_20240722::Span<char>::empty((Span<char> *)local_88);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    pcVar5 = absl::lts_20240722::Span<char>::data((Span<char> *)local_88);
    *(pointer *)size_local = pcVar5;
    sVar6 = absl::lts_20240722::Span<char>::size((Span<char> *)local_88);
    if (cord_size < sVar6) {
      *(int *)desired_size = (int)cord_size;
      absl::lts_20240722::CordBuffer::IncreaseLengthBy(&this->buffer_,cord_size);
      this->state_ = kPartial;
    }
    else {
      sVar6 = absl::lts_20240722::Span<char>::size((Span<char> *)local_88);
      *(int *)desired_size = (int)sVar6;
      sVar6 = absl::lts_20240722::Span<char>::size((Span<char> *)local_88);
      absl::lts_20240722::CordBuffer::IncreaseLengthBy(&this->buffer_,sVar6);
      this->state_ = kFull;
    }
    return true;
  }
  __assert_fail("!span.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                ,0x275,"virtual bool google::protobuf::io::CordOutputStream::Next(void **, int *)");
}

Assistant:

bool CordOutputStream::Next(void** data, int* size) {
  // Use 128 bytes as a minimum buffer size if we don't have any application
  // provided size hints. This number is picked somewhat arbitrary as 'small
  // enough to avoid excessive waste on small data, and large enough to not
  // waste CPU and memory on tiny buffer overhead'.
  // It is worth noting that absent size hints, we pick 'current size' as
  // the default buffer size (capped at max flat size), which means we quickly
  // double the buffer size. This is in contrast to `Cord::Append()` functions
  // accepting strings which use a conservative 10% growth.
  static const size_t kMinBlockSize = 128;

  size_t desired_size, max_size;
  const size_t cord_size = cord_.size() + buffer_.length();
  if (size_hint_ > cord_size) {
    // Try to hit size_hint_ exactly so the caller doesn't receive a larger
    // buffer than indicated, requiring a non-zero call to BackUp() to undo
    // the buffer capacity we returned beyond the indicated size hint.
    desired_size = size_hint_ - cord_size;
    max_size = desired_size;
  } else {
    // We're past the size hint or don't have a size hint.  Try to allocate a
    // block as large as what we have so far, or at least kMinBlockSize bytes.
    // CordBuffer will truncate this to an appropriate size if it is too large.
    desired_size = std::max(cord_size, kMinBlockSize);
    max_size = std::numeric_limits<size_t>::max();
  }

  switch (state_) {
    case State::kSteal:
      // Steal last buffer from Cord if available.
      assert(buffer_.length() == 0);
      buffer_ = cord_.GetAppendBuffer(desired_size);
      break;
    case State::kPartial:
      // Use existing capacity in 'buffer_`
      assert(buffer_.length() < buffer_.capacity());
      break;
    case State::kFull:
      assert(buffer_.length() > 0);
      cord_.Append(std::move(buffer_));
      ABSL_FALLTHROUGH_INTENDED;
    case State::kEmpty:
      assert(buffer_.length() == 0);
      buffer_ = absl::CordBuffer::CreateWithDefaultLimit(desired_size);
      break;
  }

  // Get all available capacity from the buffer.
  absl::Span<char> span = buffer_.available();
  assert(!span.empty());
  *data = span.data();

  // Only hand out up to 'max_size', which is limited if there is a size hint
  // specified, and we have more available than the size hint.
  if (span.size() > max_size) {
    *size = static_cast<int>(max_size);
    buffer_.IncreaseLengthBy(max_size);
    state_ = State::kPartial;
  } else {
    *size = static_cast<int>(span.size());
    buffer_.IncreaseLengthBy(span.size());
    state_ = State::kFull;
  }

  return true;
}